

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool TwoBytesTest2<unsigned_long>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  HashCallback<unsigned_long> c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  KeyCallback local_28;
  undefined1 *local_18;
  pfHash local_10;
  
  local_18 = (undefined1 *)&local_48;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.m_count = 0;
  local_28._vptr_KeyCallback = (_func_int **)&PTR__KeyCallback_001abde8;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10 = hash;
  TwoBytesKeygen(maxlen,&local_28);
  bVar1 = TestHashList<unsigned_long>(&local_48,drawDiagram,true,true,true,true);
  putchar(10);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}